

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O2

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateOptionalArrayedI32
          (BuiltInsValidator *this,Decoration *decoration,Instruction *inst,
          function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *diag)

{
  uint in_EAX;
  spv_result_t sVar1;
  Op OVar2;
  Instruction *pIVar3;
  uint underlying_type_00;
  uint32_t underlying_type;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  sVar1 = GetUnderlyingType(this->_,decoration,inst,(uint32_t *)((long)&uStack_28 + 4));
  if (sVar1 == SPV_SUCCESS) {
    OVar2 = ValidationState_t::GetIdOpcode(this->_,uStack_28._4_4_);
    underlying_type_00 = uStack_28._4_4_;
    if (OVar2 == OpTypeArray) {
      pIVar3 = ValidationState_t::FindDef(this->_,uStack_28._4_4_);
      underlying_type_00 =
           (pIVar3->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start[2];
      uStack_28 = CONCAT44(underlying_type_00,(undefined4)uStack_28);
    }
    sVar1 = ValidateI32Helper(this,decoration,inst,diag,underlying_type_00);
  }
  return sVar1;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateOptionalArrayedI32(
    const Decoration& decoration, const Instruction& inst,
    const std::function<spv_result_t(const std::string& message)>& diag) {
  uint32_t underlying_type = 0;
  if (spv_result_t error =
          GetUnderlyingType(_, decoration, inst, &underlying_type)) {
    return error;
  }

  // Strip the array, if present.
  if (_.GetIdOpcode(underlying_type) == spv::Op::OpTypeArray) {
    underlying_type = _.FindDef(underlying_type)->word(2u);
  }

  return ValidateI32Helper(decoration, inst, diag, underlying_type);
}